

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
* __thiscall
NJamSpell::TSpellCorrector::GetCandidates
          (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *__return_storage_ptr__,TSpellCorrector *this,
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *sentence,size_t position)

{
  pointer pbVar1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *w;
  pointer pbVar2;
  undefined1 auVar3 [8];
  undefined1 local_90 [8];
  TWords candidates;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_68;
  undefined1 auStack_48 [8];
  TWords words;
  
  auStack_48 = (undefined1  [8])0x0;
  words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar2 = (sentence->
           super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (sentence->
           super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)position;
  if (pbVar2 != pbVar1) {
    do {
      local_68._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
      local_68._M_string_length = pbVar2->_M_string_length;
      if (words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
          super__Vector_impl_data._M_start ==
          words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::
        _M_realloc_insert<NJamSpell::TWord>
                  ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)auStack_48,
                   (iterator)
                   words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                   _M_impl.super__Vector_impl_data._M_start,(TWord *)&local_68);
      }
      else {
        (words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
         super__Vector_impl_data._M_start)->Ptr = local_68._M_dataplus._M_p;
        (words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
         super__Vector_impl_data._M_start)->Len = local_68._M_string_length;
        words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
        super__Vector_impl_data._M_start =
             words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != pbVar1);
  }
  GetCandidatesRaw((TWords *)local_90,this,(TWords *)auStack_48,
                   (size_t)candidates.
                           super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_90 !=
      (undefined1  [8])
      candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
      super__Vector_impl_data._M_start) {
    auVar3 = local_90;
    do {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>
                ((wstring *)&local_68,((pointer)auVar3)->Ptr,
                 ((pointer)auVar3)->Ptr + ((pointer)auVar3)->Len);
      std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>::
      emplace_back<std::__cxx11::wstring>
                ((vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>> *)
                 __return_storage_ptr__,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      auVar3 = (undefined1  [8])((long)auVar3 + 0x10);
    } while (auVar3 != (undefined1  [8])
                       candidates.
                       super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                       _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_90 != (undefined1  [8])0x0) {
    operator_delete((void *)local_90);
  }
  if (auStack_48 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::wstring> TSpellCorrector::GetCandidates(const std::vector<std::wstring>& sentence, size_t position) const {
    TWords words;
    for (auto&& w: sentence) {
        words.push_back(TWord(w));
    }
    TWords candidates = GetCandidatesRaw(words, position);
    std::vector<std::wstring> results;
    for (auto&& c: candidates) {
        results.push_back(std::wstring(c.Ptr, c.Len));
    }
    return results;
}